

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> __thiscall
dtc::input_buffer::buffer_for_file(input_buffer *this,string *path,bool warn)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  stream_input_buffer *this_00;
  char *pcVar4;
  undefined8 uVar5;
  int *piVar6;
  mmap_input_buffer *this_01;
  string local_e8;
  undefined1 local_c1;
  undefined1 local_c0 [8];
  stat st;
  int source;
  bool warn_local;
  string *path_local;
  unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *b;
  
  bVar2 = std::operator==(path,"-");
  if (bVar2) {
    this_00 = (stream_input_buffer *)operator_new(0x30);
    anon_unknown.dwarf_82912::stream_input_buffer::stream_input_buffer(this_00);
    std::unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>>::
    unique_ptr<std::default_delete<dtc::input_buffer>,void>
              ((unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>> *)this,
               (pointer)this_00);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    st.__glibc_reserved[2]._0_4_ = open(pcVar4,0);
    pFVar1 = _stderr;
    if ((int)st.__glibc_reserved[2] == -1) {
      if (warn) {
        uVar5 = std::__cxx11::string::c_str();
        piVar6 = __errno_location();
        pcVar4 = strerror(*piVar6);
        fprintf(pFVar1,"Unable to open file \'%s\'.  %s\n",uVar5,pcVar4);
      }
      std::unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>>::
      unique_ptr<std::default_delete<dtc::input_buffer>,void>
                ((unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>> *)this,
                 (nullptr_t)0x0);
    }
    else {
      iVar3 = fstat((int)st.__glibc_reserved[2],(stat *)local_c0);
      pFVar1 = _stderr;
      if ((iVar3 == 0) && (((uint)st.st_nlink & 0xf000) == 0x4000)) {
        if (warn) {
          uVar5 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"File %s is a directory\n",uVar5);
        }
        close((int)st.__glibc_reserved[2]);
        std::unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>>::
        unique_ptr<std::default_delete<dtc::input_buffer>,void>
                  ((unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        local_c1 = 0;
        this_01 = (mmap_input_buffer *)operator_new(0x38);
        iVar3 = (int)st.__glibc_reserved[2];
        std::__cxx11::string::string((string *)&local_e8,(string *)path);
        anon_unknown.dwarf_82912::mmap_input_buffer::mmap_input_buffer(this_01,iVar3,&local_e8);
        std::unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>>::
        unique_ptr<std::default_delete<dtc::input_buffer>,void>
                  ((unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>> *)this,
                   (pointer)this_01);
        std::__cxx11::string::~string((string *)&local_e8);
        close((int)st.__glibc_reserved[2]);
      }
    }
  }
  return (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<input_buffer>
input_buffer::buffer_for_file(const string &path, bool warn)
{
	if (path == "-")
	{
		std::unique_ptr<input_buffer> b(new stream_input_buffer());
		return b;
	}
	int source = open(path.c_str(), O_RDONLY);
	if (source == -1)
	{
		if (warn)
		{
			fprintf(stderr, "Unable to open file '%s'.  %s\n", path.c_str(), strerror(errno));
		}
		return 0;
	}
	struct stat st;
	if (fstat(source, &st) == 0 && S_ISDIR(st.st_mode))
	{
		if (warn)
		{
			fprintf(stderr, "File %s is a directory\n", path.c_str());
		}
		close(source);
		return 0;
	}
	std::unique_ptr<input_buffer> b(new mmap_input_buffer(source, string(path)));
	close(source);
	return b;
}